

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O3

int Abc_NtkConvertToBlifMv(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  int iVar2;
  Mem_Flex_t *pMmMan;
  Vec_Str_t *vCube;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  Vec_Ptr_t *pVVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  byte *pbVar11;
  long lVar12;
  char *pSop1;
  char *pSop0;
  byte *local_40;
  byte *local_38;
  byte *pbVar6;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x3c6,"int Abc_NtkConvertToBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkToBdd(pNtk);
  if (iVar1 == 0) {
    puts("Converting logic functions to BDDs has failed.");
    iVar1 = 0;
  }
  else {
    pMmMan = Mem_FlexStart();
    vCube = (Vec_Str_t *)malloc(0x10);
    vCube->nCap = 100;
    vCube->nSize = 0;
    pcVar3 = (char *)malloc(100);
    vCube->pArray = pcVar3;
    pVVar7 = pNtk->vObjs;
    if (0 < pVVar7->nSize) {
      lVar12 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar7->pArray[lVar12];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          Abc_NodeBddToCnf(pNode,pMmMan,vCube,0,(char **)&local_38,(char **)&local_40);
          iVar1 = Abc_SopGetCubeNum((char *)local_38);
          iVar2 = Abc_SopGetCubeNum((char *)local_40);
          pbVar11 = (byte *)((long)(iVar2 + iVar1) * ((long)(pNode->vFanins).nSize * 2 + 2) + 1);
          pbVar4 = (byte *)Mem_FlexEntryFetch(pMmMan,(int)pbVar11);
          bVar10 = *local_38;
          pbVar5 = pbVar4;
          pbVar8 = local_38;
          while (pbVar9 = local_40, pbVar6 = pbVar8, bVar10 != 0) {
            while( true ) {
              if ((bVar10 & 0xdf) == 0) break;
              *pbVar5 = bVar10;
              pbVar5[1] = 0x20;
              bVar10 = pbVar6[1];
              pbVar5 = pbVar5 + 2;
              pbVar6 = pbVar6 + 1;
            }
            pbVar5[0] = 0x30;
            pbVar5[1] = 10;
            pbVar8 = pbVar8 + (long)(pNode->vFanins).nSize + 3;
            pbVar5 = pbVar5 + 2;
            bVar10 = *pbVar8;
          }
          for (; bVar10 = *pbVar9, pbVar6 = pbVar5, pbVar8 = pbVar9, bVar10 != 0;
              pbVar9 = pbVar9 + (long)(pNode->vFanins).nSize + 3) {
            while( true ) {
              pbVar5 = pbVar6 + 2;
              if ((bVar10 & 0xdf) == 0) break;
              *pbVar6 = bVar10;
              pbVar6[1] = 0x20;
              bVar10 = pbVar8[1];
              pbVar6 = pbVar5;
              pbVar8 = pbVar8 + 1;
            }
            pbVar6[0] = 0x31;
            pbVar6[1] = 10;
          }
          *pbVar5 = 0;
          if (pbVar5 + (1 - (long)pbVar4) != pbVar11) {
            __assert_fail("pCur - pBlifMv == nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                          ,0x3ee,"int Abc_NtkConvertToBlifMv(Abc_Ntk_t *)");
          }
          Cudd_RecursiveDeref((DdManager *)pNtk->pManFunc,(DdNode *)(pNode->field_5).pData);
          (pNode->field_5).pData = pbVar4;
          pVVar7 = pNtk->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar7->nSize);
    }
    pNtk->ntkFunc = ABC_FUNC_BLIFMV;
    Cudd_Quit((DdManager *)pNtk->pManFunc);
    pNtk->pManFunc = pMmMan;
    if (vCube->pArray != (char *)0x0) {
      free(vCube->pArray);
    }
    free(vCube);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_NtkConvertToBlifMv( Abc_Ntk_t * pNtk )
{
#ifdef ABC_USE_CUDD
    Mem_Flex_t * pMmFlex;
    Abc_Obj_t * pNode;
    Vec_Str_t * vCube;
    char * pSop0, * pSop1, * pBlifMv, * pCube, * pCur;
    int Value, nCubes, nSize, i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    if ( !Abc_NtkToBdd(pNtk) )
    {
        printf( "Converting logic functions to BDDs has failed.\n" );
        return 0;
    }

    pMmFlex = Mem_FlexStart();
    vCube   = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // convert BDD into cubes for on-set and off-set
        Abc_NodeBddToCnf( pNode, pMmFlex, vCube, 0, &pSop0, &pSop1 );
        // allocate room for the MV-SOP
        nCubes = Abc_SopGetCubeNum(pSop0) + Abc_SopGetCubeNum(pSop1);
        nSize = nCubes*(2*Abc_ObjFaninNum(pNode) + 2)+1;
        pBlifMv = Mem_FlexEntryFetch( pMmFlex, nSize );
        // add the cubes
        pCur = pBlifMv;
        Abc_SopForEachCube( pSop0, Abc_ObjFaninNum(pNode), pCube )
        {
            Abc_CubeForEachVar( pCube, Value, k )
            {
                *pCur++ = Value;
                *pCur++ = ' ';
            }
            *pCur++ = '0';
            *pCur++ = '\n';
        }
        Abc_SopForEachCube( pSop1, Abc_ObjFaninNum(pNode), pCube )
        {
            Abc_CubeForEachVar( pCube, Value, k )
            {
                *pCur++ = Value;
                *pCur++ = ' ';
            }
            *pCur++ = '1';
            *pCur++ = '\n';
        }
        *pCur++ = 0;
        assert( pCur - pBlifMv == nSize );
        // update the node representation
        Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pNode->pData );
        pNode->pData = pBlifMv;
    }

    // update the functionality type
    pNtk->ntkFunc = ABC_FUNC_BLIFMV;
    Cudd_Quit( (DdManager *)pNtk->pManFunc );
    pNtk->pManFunc = pMmFlex;

    Vec_StrFree( vCube );
#endif
    return 1;
}